

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O2

PaError Pa_StartStream(PaStream *stream)

{
  PaError PVar1;
  
  PVar1 = PaUtil_ValidateStreamPointer(stream);
  if (PVar1 == 0) {
    PVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 0x20))(stream);
    if (PVar1 == 0) {
      PVar1 = -0x26fe;
    }
    else if (PVar1 == 1) {
      PVar1 = (**(code **)(*(long *)((long)stream + 0x10) + 8))(stream);
      return PVar1;
    }
  }
  return PVar1;
}

Assistant:

PaError Pa_StartStream( PaStream *stream )
{
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_StartStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    if( result == paNoError )
    {
        result = PA_STREAM_INTERFACE(stream)->IsStopped( stream );
        if( result == 0 )
        {
            result = paStreamIsNotStopped ;
        }
        else if( result == 1 )
        {
            result = PA_STREAM_INTERFACE(stream)->Start( stream );
        }
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_StartStream", result );

    return result;
}